

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::SequenceWithMatchExpr::fromSyntax
          (ParenthesizedSequenceExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  undefined4 extraout_var;
  SequenceWithMatchExpr *pSVar2;
  SourceRange sourceRange;
  optional<slang::ast::SequenceRepetition> repetition;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_48;
  _Storage<slang::ast::SequenceRepetition,_true> local_34;
  undefined1 local_24;
  AssertionExpr *this;
  
  iVar1 = AssertionExpr::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  this = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence(this,context,(DiagCode)0x350008);
  local_24 = 0;
  if (syntax->repetition != (SequenceRepetitionSyntax *)0x0) {
    SequenceRepetition::SequenceRepetition(&local_34._M_value,syntax->repetition,context);
    local_24 = 1;
    if (local_34._M_value.kind != Consecutive) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->repetition->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0x440008,sourceRange);
    }
  }
  local_48 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0);
  if (syntax->matchList != (SequenceMatchListSyntax *)0x0) {
    local_48 = bindMatchItems(syntax->matchList,context,this);
  }
  pSVar2 = BumpAllocator::
           emplace<slang::ast::SequenceWithMatchExpr,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRepetition>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                     (&((context->scope).ptr)->compilation->super_BumpAllocator,this,
                      (optional<slang::ast::SequenceRepetition> *)&local_34._M_value,&local_48);
  return &pSVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& SequenceWithMatchExpr::fromSyntax(const ParenthesizedSequenceExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& expr = bind(*syntax.expr, context);
    expr.requireSequence(context);

    std::optional<SequenceRepetition> repetition;
    if (syntax.repetition) {
        repetition.emplace(*syntax.repetition, context);
        if (repetition->kind != SequenceRepetition::Consecutive)
            context.addDiag(diag::SeqInstanceRepetition, syntax.repetition->sourceRange());
    }

    std::span<const Expression* const> matchItems;
    if (syntax.matchList)
        matchItems = bindMatchItems(*syntax.matchList, context, expr);

    return *context.getCompilation().emplace<SequenceWithMatchExpr>(expr, repetition, matchItems);
}